

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAlignedObjectArray.h
# Opt level: O1

void __thiscall
cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE>::~cbtAlignedObjectArray
          (cbtAlignedObjectArray<BT_QUANTIZED_BVH_NODE> *this)

{
  if (this->m_data != (BT_QUANTIZED_BVH_NODE *)0x0) {
    if (this->m_ownsMemory == true) {
      cbtAlignedFreeInternal(this->m_data);
    }
    this->m_data = (BT_QUANTIZED_BVH_NODE *)0x0;
  }
  this->m_ownsMemory = true;
  this->m_data = (BT_QUANTIZED_BVH_NODE *)0x0;
  this->m_size = 0;
  this->m_capacity = 0;
  return;
}

Assistant:

~cbtAlignedObjectArray()
	{
		clear();
	}